

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O3

void map_object(obj *obj,int show)

{
  uint uVar1;
  obj *poVar2;
  boolean bVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  int x;
  int y;
  rm *prVar9;
  rm *loc_override;
  int iVar10;
  uint uVar11;
  rm tmp_loc;
  
  x = (int)obj->ox;
  y = (int)obj->oy;
  if ((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) {
LAB_00169090:
    iVar10 = (int)obj->otyp;
  }
  else {
    if (u.umonnum != u.umonster) {
      bVar3 = dmgtype(youmonst.data,0x24);
      if (bVar3 != '\0') goto LAB_00169090;
    }
    iVar10 = display_rng(0x219);
    iVar10 = iVar10 + 1;
  }
  prVar9 = level->locations[x] + y;
  loc_override = prVar9;
  if (((level->flags).field_0x9 & 0x40) == 0) {
    loc_override = &tmp_loc;
    tmp_loc._8_4_ = *(undefined4 *)&level->locations[x][y].field_0x8;
    tmp_loc._0_4_ = *(undefined4 *)&prVar9->field_0x0;
    tmp_loc.typ = prVar9->typ;
    tmp_loc.seenv = prVar9->seenv;
    tmp_loc._6_2_ = *(undefined2 *)&prVar9->field_0x6;
  }
  if (((iVar10 != 0xf6) && (iVar10 != 0x215)) && (iVar4 = 0, iVar10 != 0x10e)) goto LAB_001691a6;
  if ((u.uprops[0x23].intrinsic == 0) || (u.uprops[0x24].extrinsic != 0)) {
LAB_00169156:
    iVar4 = obj->corpsenm;
    if (iVar4 - 0x89U < 0x14) {
      iVar7 = 0x93;
      if (iVar4 - 0x89U < 10) {
        iVar7 = 0x89;
      }
      iVar4 = (uint)(ushort)objects[(long)(iVar4 - iVar7) + 0x5f].oc_descr_idx + iVar7 + -0x5f;
    }
  }
  else {
    if (u.umonnum != u.umonster) {
      bVar3 = dmgtype(youmonst.data,0x24);
      if (bVar3 != '\0') goto LAB_00169156;
    }
    iVar4 = display_rng(0x193);
  }
LAB_001691a6:
  uVar11 = iVar10 * 0x800 + 0x800U & 0x1ff800;
  uVar1 = *(uint *)loc_override;
  uVar5 = iVar4 * 0x200000 + 0x200000U & 0x3fe00000;
  *(uint *)loc_override = uVar5 | uVar1 & 0xc00007ff | uVar11;
  uVar6 = 0;
  uVar8 = 0;
  if (obj->otyp != 0x214) {
    poVar2 = level->objects[x][y];
    uVar8 = 0;
    if (poVar2 != (obj *)0x0) {
      uVar8 = (uint)((poVar2->v).v_nexthere != (obj *)0x0) << 0x1e;
    }
  }
  *(uint *)loc_override = uVar5 | uVar1 & 0x800007ff | uVar11 | uVar8;
  if (((obj->field_0x4b & 0x20) != 0) && ((obj->otyp & 0xfffeU) != 0xda)) {
    uVar6 = (uint)(obj->otyp != 0xdc) << 0x1f;
  }
  *(uint *)loc_override = uVar5 | uVar1 & 0x7ff | uVar11 | uVar8 | uVar6;
  if (show != 0) {
    dbuf_set(level,x,y,loc_override,-1,-1,-1,-1,-1,-1,0,0,0,0);
  }
  return;
}

Assistant:

void map_object(struct obj *obj, int show)
{
    int x = obj->ox, y = obj->oy;
    int objtyp = what_obj(obj->otyp);
    int monnum = 0;
    struct rm *loc = &level->locations[x][y];
    struct rm tmp_loc;

    if (!level->flags.hero_memory) {
	tmp_loc = *loc;
	loc = &tmp_loc;
    }

    if (objtyp == CORPSE || objtyp == STATUE || objtyp == FIGURINE) {
	if (Hallucination)
	    monnum = random_monster();
	else
	    monnum = obfuscate_monster(obj->corpsenm);
    }
    loc->mem_obj = objtyp + 1;
    loc->mem_obj_mn = monnum + 1;
    loc->mem_obj_stacks = obj->otyp != BOULDER &&
			  level->objects[x][y] && level->objects[x][y]->nexthere;
    loc->mem_obj_prize = Is_prize(obj);

    if (show)
	dbuf_set(level, x, y, loc, -1, -1, -1, -1, -1, -1, 0, 0, 0, 0);
}